

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_skeleton_blocker_simplifiable.cpp
# Opt level: O3

void __thiscall
test_skeleton_blocker_simplifiable_link_condition1::test_method
          (test_skeleton_blocker_simplifiable_link_condition1 *this)

{
  bool bVar1;
  long *plVar2;
  Complex complex;
  undefined1 local_188 [48];
  undefined1 local_158;
  undefined8 local_150;
  shared_count sStack_148;
  char *local_140;
  _Base_ptr local_138;
  char *local_130;
  _Base_ptr local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> local_d0;
  
  Gudhi::skeleton_blocker::
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
  Skeleton_blocker_complex(&local_d0,0,(Visitor *)0x0);
  build_complete(4,&local_d0);
  Gudhi::skeleton_blocker::
  Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>::
  Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
            ((Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
              *)local_188,(Vertex_handle)0x0,(Vertex_handle)0x1,(Vertex_handle)0x2);
  Gudhi::skeleton_blocker::
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::add_blocker
            (&local_d0,(Simplex *)local_188);
  std::
  _Rb_tree<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::_Identity<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
  ::~_Rb_tree((_Rb_tree<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::_Identity<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
               *)local_188);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"complex complex",0xf);
  Gudhi::skeleton_blocker::
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
  to_string_abi_cxx11_((string *)local_188,&local_d0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,(char *)local_188._0_8_,CONCAT71(local_188._9_7_,local_188[8]));
  if ((undefined1 *)local_188._0_8_ != local_188 + 0x10) {
    operator_delete((void *)local_188._0_8_,(ulong)(local_188._16_8_ + 1));
  }
  std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + ' ');
  std::ostream::put(' ');
  plVar2 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  local_e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Skeleton_blocker/test/test_skeleton_blocker_simplifiable.cpp"
  ;
  local_d8 = "";
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e0,0x74);
  local_158 = Gudhi::skeleton_blocker::
              Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
              link_condition(&local_d0,(Vertex_handle)0x1,(Vertex_handle)0x2,true);
  local_150 = 0;
  sStack_148.pi_ = (sp_counted_base *)0x0;
  local_140 = "complex.link_condition(Vertex_handle(1), Vertex_handle(2), true)";
  local_138 = (_Base_ptr)0x11844d;
  local_188[8] = _S_red;
  local_188._0_8_ = &PTR__lazy_ostream_00122bb0;
  local_188._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Skeleton_blocker/test/test_skeleton_blocker_simplifiable.cpp"
  ;
  local_f8 = "";
  local_188._24_8_ = (_Base_ptr)&local_140;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_148);
  local_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Skeleton_blocker/test/test_skeleton_blocker_simplifiable.cpp"
  ;
  local_108 = "";
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_110,0x76);
  bVar1 = Gudhi::skeleton_blocker::
          Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
          link_condition(&local_d0,(Vertex_handle)0x1,(Vertex_handle)0x2,false);
  local_158 = !bVar1;
  local_150 = 0;
  sStack_148.pi_ = (sp_counted_base *)0x0;
  local_140 = "!complex.link_condition(Vertex_handle(1), Vertex_handle(2), false)";
  local_138 = (_Base_ptr)0x118490;
  local_188[8] = _S_red;
  local_188._0_8_ = &PTR__lazy_ostream_00122bb0;
  local_188._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Skeleton_blocker/test/test_skeleton_blocker_simplifiable.cpp"
  ;
  local_128 = (_Base_ptr)0x11810a;
  local_188._24_8_ = (_Base_ptr)&local_140;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_148);
  Gudhi::skeleton_blocker::
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
  ~Skeleton_blocker_complex(&local_d0);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_skeleton_blocker_simplifiable_link_condition1) {
  Complex complex(0);
  // Build the complexes
  build_complete(4, complex);
  complex.add_blocker(Simplex(static_cast<Vertex_handle> (0), static_cast<Vertex_handle> (1), static_cast<Vertex_handle> (2)));

  // Print result
  std::clog << "complex complex" << complex.to_string();
  std::clog << std::endl << std::endl;

  BOOST_CHECK(complex.link_condition(Vertex_handle(1), Vertex_handle(2), true));

  BOOST_CHECK(!complex.link_condition(Vertex_handle(1), Vertex_handle(2), false));
}